

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int * parasail_result_get_score_row(parasail_result_t *result)

{
  int iVar1;
  parasail_result_t *result_local;
  
  if (result == (parasail_result_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_result_get_score_row","result");
    result_local = (parasail_result_t *)0x0;
  }
  else {
    iVar1 = parasail_result_is_stats_rowcol(result);
    if ((iVar1 == 0) && (iVar1 = parasail_result_is_rowcol(result), iVar1 == 0)) {
      fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_score_row",
              "parasail_result_is_stats_rowcol(result) || parasail_result_is_rowcol(result)");
      return (int *)0x0;
    }
    iVar1 = parasail_result_is_stats_rowcol(result);
    if (iVar1 == 0) {
      iVar1 = parasail_result_is_rowcol(result);
      if (iVar1 == 0) {
        result_local = (parasail_result_t *)0x0;
      }
      else {
        result_local = (parasail_result_t *)((result->field_4).rowcols)->score_row;
      }
    }
    else {
      result_local = *((result->field_4).trace)->trace_del_table;
    }
  }
  return &result_local->score;
}

Assistant:

int* parasail_result_get_score_row(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_stats_rowcol(result) || parasail_result_is_rowcol(result));
    if (parasail_result_is_stats_rowcol(result)) {
        return result->stats->rowcols->score_row;
    }
    if (parasail_result_is_rowcol(result)) {
        return result->rowcols->score_row;
    }
    return NULL; /* should not reach */
}